

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_ConstIterators_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ConstIterators_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  iterator it_00;
  bool bVar1;
  char *pcVar2;
  char *in_RDI;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  const_iterator it;
  HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffe48;
  bool *success;
  const_iterator *this_00;
  char *message;
  undefined4 in_stack_fffffffffffffe78;
  Type in_stack_fffffffffffffe7c;
  AssertHelper *in_stack_fffffffffffffe80;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffe90;
  pointer in_stack_fffffffffffffeb0;
  pointer in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffffec8;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffed0;
  AssertionResult local_118;
  string local_108 [64];
  iterator local_c8;
  dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_a8;
  undefined1 local_89;
  AssertionResult local_88;
  bool *local_78;
  const_iterator *local_70;
  char *local_60;
  dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_58 [3];
  value_type local_10;
  
  pcVar2 = in_RDI + 0x10;
  local_10 = HashtableTest<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffffe48,0);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffed0,(value_type *)in_stack_fffffffffffffec8);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffffe90);
  it_00.super_iterator.pos._0_4_ = (int)pcVar2;
  it_00.super_iterator.ht =
       (dense_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)local_60;
  it_00.super_iterator.pos._4_4_ = (int)((ulong)pcVar2 >> 0x20);
  it_00.super_iterator.end = (pointer)in_RDI;
  it_00.parent_._0_4_ = in_stack_fffffffffffffe78;
  it_00.parent_._4_4_ = in_stack_fffffffffffffe7c;
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_iterator::const_iterator(local_70,it_00);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_fffffffffffffe90);
  google::
  dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::dense_hashtable_const_iterator(&local_a8,&local_c8);
  local_89 = google::
             dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             ::operator!=(local_58,&local_a8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_70,local_78,(type *)0xaa0633);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_88);
  success = local_78;
  this_00 = local_70;
  message = local_60;
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
               (char *)in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,in_RDI,
               (int)((ulong)pcVar2 >> 0x20),local_60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffed0,(Message *)in_stack_fffffffffffffec8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_70);
    std::__cxx11::string::~string(local_108);
    testing::Message::~Message((Message *)0xaa06f4);
    success = local_78;
    this_00 = local_70;
    message = local_60;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xaa078b);
  google::
  dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator++(&this_00->super_const_iterator);
  google::
  BaseHashtableInterface<google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_fffffffffffffe90);
  google::
  dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::dense_hashtable_const_iterator
            ((dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)&stack0xfffffffffffffec8,(iterator *)&stack0xfffffffffffffea8);
  google::
  dense_hashtable_const_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator==(local_58,(const_iterator *)&stack0xfffffffffffffec8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,success,(type *)0xaa07f4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_118);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
               (char *)in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,in_RDI,
               (int)((ulong)pcVar2 >> 0x20),message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffed0,(Message *)in_stack_fffffffffffffec8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe78);
    testing::Message::~Message((Message *)0xaa08ac);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xaa0931);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ConstIterators) {
  this->ht_.insert(this->UniqueObject(1));
  typename TypeParam::const_iterator it = this->ht_.begin();
  EXPECT_TRUE(it != this->ht_.end());
  ++it;
  EXPECT_TRUE(it == this->ht_.end());
}